

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creation_set.c
# Opt level: O0

int cset_auto_compress(creation_set *cset,char *filename)

{
  int count;
  undefined4 uVar1;
  char *suffix;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  filter_set *pfVar5;
  filter_set *pfVar6;
  filter_set *pfVar7;
  int local_58;
  int local_54;
  int r;
  int i;
  filter_set *v;
  int old_filter_count;
  char *code;
  char *p;
  char *name;
  filter_set *old_filters;
  char *filename_local;
  creation_set *cset_local;
  
  p = strdup(filename);
  if (p == (char *)0x0) {
    lafe_errc(1,0,"No memory");
  }
  pfVar5 = cset->filters;
  count = cset->filter_count;
  cset->filters = (filter_set *)0x0;
  cset->filter_count = 0;
LAB_0010dd96:
  do {
    suffix = strrchr(p,0x2e);
    if (suffix == (char *)0x0) {
LAB_0010de85:
      free(p);
      if (cset->filters == (filter_set *)0x0) {
        cset->filters = pfVar5;
        cset->filter_count = count;
        cset_local._4_4_ = 0;
      }
      else {
        _cleanup_filters(pfVar5,count);
        pfVar5 = (filter_set *)malloc((long)cset->filter_count << 4);
        if (pfVar5 == (filter_set *)0x0) {
          lafe_errc(1,0,"No memory");
        }
        local_54 = 0;
        local_58 = cset->filter_count;
        while (0 < local_58) {
          pfVar6 = pfVar5 + local_54;
          local_58 = local_58 + -1;
          pfVar7 = cset->filters + local_58;
          uVar1 = *(undefined4 *)&pfVar7->field_0x4;
          pfVar6->program = pfVar7->program;
          *(undefined4 *)&pfVar6->field_0x4 = uVar1;
          pfVar6->filter_name = pfVar7->filter_name;
          local_54 = local_54 + 1;
        }
        free(cset->filters);
        cset->filters = pfVar5;
        cset_local._4_4_ = 1;
      }
      return cset_local._4_4_;
    }
    pcVar2 = get_filter_code(suffix);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = get_format_code(suffix);
      if (pcVar2 != (char *)0x0) {
        cset_set_format(cset,pcVar2);
        goto LAB_0010de85;
      }
      pcVar2 = decompose_alias(suffix);
      if (pcVar2 == (char *)0x0) goto LAB_0010de85;
      *suffix = '\0';
      sVar3 = strlen(p);
      sVar4 = strlen(pcVar2);
      p = (char *)realloc(p,sVar3 + sVar4 + 1);
      if (p == (char *)0x0) {
        lafe_errc(1,0,"No memory");
      }
      strcat(p,pcVar2);
      goto LAB_0010dd96;
    }
    cset_add_filter(cset,pcVar2);
    *suffix = '\0';
  } while( true );
}

Assistant:

int
cset_auto_compress(struct creation_set *cset, const char *filename)
{
	struct filter_set *old_filters;
	char *name, *p;
	const char *code;
	int old_filter_count;

	name = strdup(filename);
	if (name == NULL)
		lafe_errc(1, 0, "No memory");
	/* Save previous filters. */
	old_filters = cset->filters;
	old_filter_count = cset->filter_count;
	cset->filters = NULL;
	cset->filter_count = 0;

	for (;;) {
		/* Get the suffix. */
		p = strrchr(name, '.');
		if (p == NULL)
			break;
		/* Suppose it indicates compression/filter type
		 * such as ".gz". */
		code = get_filter_code(p);
		if (code != NULL) {
			cset_add_filter(cset, code);
			*p = '\0';
			continue;
		}
		/* Suppose it indicates format type such as ".tar". */
		code = get_format_code(p);
		if (code != NULL) {
			cset_set_format(cset, code);
			break;
		}
		/* Suppose it indicates alias such as ".tgz". */
		code = decompose_alias(p);
		if (code == NULL)
			break;
		/* Replace the suffix. */
		*p = '\0';
		name = realloc(name, strlen(name) + strlen(code) + 1);
		if (name == NULL)
			lafe_errc(1, 0, "No memory");
		strcat(name, code);
	}
	free(name);
	if (cset->filters) {
		struct filter_set *v;
		int i, r;

		/* Release previous filters. */
		_cleanup_filters(old_filters, old_filter_count);

		v = malloc(sizeof(*v) * cset->filter_count);
		if (v == NULL)
			lafe_errc(1, 0, "No memory");
		/* Reverse filter sequence. */
		for (i = 0, r = cset->filter_count; r > 0; )
			v[i++] = cset->filters[--r];
		free(cset->filters);
		cset->filters = v;
		return (1);
	} else {
		/* Put previous filters back. */
		cset->filters = old_filters;
		cset->filter_count = old_filter_count;
		return (0);
	}
}